

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

int32_t player_adjust_mana_precise(player *p,int32_t sp_gain)

{
  uint32_t *puVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  short sVar5;
  uint uVar6;
  
  if (sp_gain == 0) {
    return 0;
  }
  sVar2 = p->csp;
  iVar4 = CONCAT22(sVar2,p->csp_frac);
  uVar6 = iVar4 + sp_gain;
  if (sp_gain < 1) {
    if (iVar4 <= -0x80000000 - sp_gain) {
      uVar6 = 0x80000000;
      sp_gain = 0;
    }
  }
  else if ((int)(sp_gain ^ 0x7fffffffU) <= iVar4) {
    uVar6 = 0x7fffffff;
    sp_gain = 0;
  }
  if ((int)uVar6 < 0) {
    uVar3 = uVar6 + 0xffff;
    if (-1 < (int)uVar6) {
      uVar3 = uVar6;
    }
    sVar5 = (short)(uVar3 >> 0x10);
    p->csp = sVar5;
    if ((int)uVar6 % 0x10000 == 0) {
      p->csp_frac = 0;
    }
    else {
      p->csp_frac = (uint16_t)((int)uVar6 % 0x10000);
      p->csp = sVar5 + -1;
    }
  }
  else {
    uVar6 = uVar6 >> 0x10 | uVar6 << 0x10;
    p->csp = (short)uVar6;
    p->csp_frac = (short)(uVar6 >> 0x10);
  }
  sVar5 = p->msp;
  if (p->csp < sVar5) {
    if (-1 < p->csp) goto LAB_001c1d01;
    sVar5 = 0;
  }
  p->csp = sVar5;
  p->csp_frac = 0;
  sp_gain = 0;
LAB_001c1d01:
  sVar5 = p->csp;
  if (sVar2 != sVar5) {
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x80;
  }
  if (sp_gain != 0) {
    return sp_gain;
  }
  return (sVar5 * 0x10000 - iVar4) + (uint)p->csp_frac;
}

Assistant:

int32_t player_adjust_mana_precise(struct player *p, int32_t sp_gain)
{
	int16_t old_16 = p->csp;
	/* Load it all into 4 byte format*/
	int32_t old_32 = ((int32_t) p->csp) * 65536 + p->csp_frac, new_32;

	if (sp_gain == 0) return 0;

	/* Check for overflow */
	if (sp_gain > 0) {
		if (old_32 < INT32_MAX - sp_gain) {
			new_32 = old_32 + sp_gain;
		} else {
			new_32 = INT32_MAX;
			sp_gain = 0;
		}
	} else if (old_32 > INT32_MIN - sp_gain) {
		new_32 = old_32 + sp_gain;
	} else {
		new_32 = INT32_MIN;
		sp_gain = 0;
	}

	/* Break it back down*/
	if (new_32 < 0) {
		/*
		 * Don't use right bitwise shift on negative values:  whether
		 * the left bits are zero or one depends on the system.
		 */
		int32_t remainder = new_32 % 65536;

		p->csp = (int16_t) (new_32 / 65536);
		if (remainder) {
			assert(remainder < 0);
			p->csp_frac = (uint16_t) (65536 + remainder);
			assert(p->csp > INT16_MIN);
			p->csp -= 1;
		} else {
			p->csp_frac = 0;
		}
	} else {
		p->csp = (int16_t)(new_32 >> 16);   /* div 65536 */
		p->csp_frac = (uint16_t)(new_32 & 0xFFFF);    /* mod 65536 */
	}

	/* Max/min SP */
	if (p->csp >= p->msp) {
		p->csp = p->msp;
		p->csp_frac = 0;
		sp_gain = 0;
	} else if (p->csp < 0) {
		p->csp = 0;
		p->csp_frac = 0;
		sp_gain = 0;
	}

	/* Notice changes */
	if (old_16 != p->csp) {
		p->upkeep->redraw |= (PR_MANA);
	}

	if (sp_gain == 0) {
		/* Recalculate */
		new_32 = ((int32_t) p->csp) * 65536 + p->csp_frac;
		sp_gain = new_32 - old_32;
	}

	return sp_gain;
}